

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  string *filename;
  pointer pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  __type _Var3;
  cmSourceFile *pcVar4;
  string *psVar5;
  const_iterator __begin3;
  pointer pbVar6;
  string incpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (info->DependDone != false) {
    return;
  }
  info->DependDone = true;
  if ((info->FullPath)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&incpath,"Attempt to find dependencies for file without path!",
               (allocator<char> *)&local_50);
    cmSystemTools::Error(&incpath);
  }
  else {
    filename = &info->FullPath;
    bVar2 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar2) {
      DependWalk(this,info);
    }
    pcVar4 = info->SourceFile;
    if (pcVar4 != (cmSourceFile *)0x0) {
      pbVar6 = (pcVar4->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pcVar4->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar6 != pbVar1) {
        for (; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
          AddDependency(this,info,(pbVar6->_M_dataplus)._M_p);
        }
        return;
      }
    }
    if (!bVar2) {
      this_00 = this->Makefile;
      cmsys::SystemTools::GetFilenameWithoutExtension(&incpath,filename);
      pcVar4 = cmMakefile::GetSource(this_00,&incpath,Ambiguous);
      std::__cxx11::string::~string((string *)&incpath);
      if (pcVar4 != (cmSourceFile *)0x0) {
        psVar5 = cmSourceFile::GetFullPath(pcVar4,(string *)0x0);
        _Var3 = std::operator==(psVar5,filename);
        if (_Var3) {
          return;
        }
        pbVar1 = (this->IncludeDirectories).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (this->IncludeDirectories).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          std::__cxx11::string::string((string *)&incpath,(string *)pbVar6);
          if ((incpath._M_string_length != 0) &&
             (incpath._M_dataplus._M_p[incpath._M_string_length - 1] != '/')) {
            std::operator+(&local_50,&incpath,"/");
            std::__cxx11::string::operator=((string *)&incpath,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::operator+(&local_50,&incpath,filename);
          std::__cxx11::string::operator=((string *)&incpath,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          psVar5 = cmSourceFile::GetFullPath(pcVar4,(string *)0x0);
          _Var3 = std::operator==(psVar5,&incpath);
          if (_Var3) {
            bVar2 = true;
            std::__cxx11::string::_M_assign((string *)filename);
          }
          std::__cxx11::string::~string((string *)&incpath);
        }
      }
    }
    if (bVar2) {
      return;
    }
    bVar2 = cmsys::RegularExpression::find(&this->ComplainFileRegularExpression,&info->IncludeName);
    if (!bVar2) {
      (info->FullPath)._M_string_length = 0;
      *(info->FullPath)._M_dataplus._M_p = '\0';
      return;
    }
    std::operator+(&incpath,"error cannot find dependencies for ",filename);
    cmSystemTools::Error(&incpath);
  }
  std::__cxx11::string::~string((string *)&incpath);
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const std::string& path = info->FullPath;
    if (path.empty()) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file.c_str());
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->GetFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath = incpath + "/";
            }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for " + path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }